

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

Abc_Cex_t * Gia_ManBmcCexGen(Bmc_Mna_t *pMan,Gia_Man_t *p,int iOut)

{
  Gia_Man_t *p_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  Abc_Cex_t *pAVar4;
  Gia_Obj_t *pObj;
  int iVar5;
  int i;
  uint uVar6;
  
  iVar5 = p->nRegs;
  pAVar4 = Abc_CexAlloc(iVar5,p->vCis->nSize - iVar5,iOut / (p->vCos->nSize - iVar5) + 1);
  iVar5 = p->vCos->nSize - p->nRegs;
  pAVar4->iFrame = iOut / iVar5;
  pAVar4->iPo = iOut % iVar5;
  uVar6 = 0xffffffff;
  i = 0;
  iVar5 = 0;
  do {
    if (pMan->vPiMap->nSize <= i) {
      if (iVar5 == pMan->pFrames->vCis->nSize - pMan->pFrames->nRegs) {
        return pAVar4;
      }
      __assert_fail("iFramePi == Gia_ManPiNum(pMan->pFrames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcAnd.c"
                    ,0x2f6,"Abc_Cex_t *Gia_ManBmcCexGen(Bmc_Mna_t *, Gia_Man_t *, int)");
    }
    uVar1 = Vec_IntEntry(pMan->vPiMap,i);
    if ((int)uVar1 < 0) {
      uVar6 = ~uVar1;
    }
    else {
      p_00 = pMan->pFrames;
      if (p_00->vCis->nSize - p_00->nRegs <= iVar5) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      pObj = Gia_ManCi(p_00,iVar5);
      iVar2 = Gia_ObjId(p_00,pObj);
      uVar3 = Vec_IntEntry(pMan->vId2Var,iVar2);
      if (((int)uVar3 < 0) || (pMan->pSat->size <= (int)uVar3)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (pMan->pSat->model[uVar3] == 1) {
        iVar2 = uVar1 + p->nRegs + (p->vCis->nSize - p->nRegs) * uVar6;
        (&pAVar4[1].iPo)[iVar2 >> 5] = (&pAVar4[1].iPo)[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
      }
      iVar5 = iVar5 + 1;
    }
    i = i + 1;
  } while( true );
}

Assistant:

Abc_Cex_t * Gia_ManBmcCexGen( Bmc_Mna_t * pMan, Gia_Man_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    int i, iObjId, iSatVar, iOrigPi;
    int iFramePi = 0, iFrame = -1;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p), Gia_ManPiNum(p), iOut / Gia_ManPoNum(p) + 1 );
    pCex->iFrame = iOut / Gia_ManPoNum(p);
    pCex->iPo = iOut % Gia_ManPoNum(p);
    // fill in the input values
    Vec_IntForEachEntry( pMan->vPiMap, iOrigPi, i )
    {
        if ( iOrigPi < 0 )
        {
            iFrame = -iOrigPi-1;
            continue;
        }
        // iOrigPi in iFrame of pGia has PI index iFramePi in pMan->pFrames,
        iObjId = Gia_ObjId( pMan->pFrames, Gia_ManPi(pMan->pFrames, iFramePi) );
        iSatVar = Vec_IntEntry( pMan->vId2Var, iObjId );
        if ( sat_solver_var_value(pMan->pSat, iSatVar) )
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p) + Gia_ManPiNum(p) * iFrame + iOrigPi );
        iFramePi++;
    }
    assert( iFramePi == Gia_ManPiNum(pMan->pFrames) );
    return pCex;
}